

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O0

size_t UpdateNodes(size_t num_bytes,size_t block_start,size_t pos,uint8_t *ringbuffer,
                  size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                  int *starting_dist_cache,size_t num_matches,BackwardMatch *matches,
                  ZopfliCostModel *model,StartPosQueue *queue,ZopfliNode *nodes)

{
  byte bVar1;
  uint32_t uVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  byte bVar7;
  long in_RCX;
  size_t in_RDX;
  long in_RSI;
  size_t in_RDI;
  char *in_R8;
  long in_R9;
  bool bVar8;
  float fVar9;
  ulong in_stack_00000008;
  ulong in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  StartPosQueue *in_stack_00000030;
  ZopfliNode *in_stack_00000038;
  float cost_1;
  uint16_t cmdcode_1;
  uint16_t copycode_1;
  size_t len_code;
  size_t max_match_len;
  float dist_cost_1;
  uint32_t distnumextra;
  uint32_t distextra;
  uint16_t dist_symbol;
  size_t dist_code;
  int is_dictionary_match;
  size_t dist;
  BackwardMatch match;
  size_t len_1;
  float cost;
  uint16_t cmdcode;
  uint16_t copycode;
  size_t l;
  float dist_cost;
  uint8_t *source;
  size_t limit;
  size_t offset;
  size_t d;
  uint8_t continuation;
  size_t len;
  size_t prev_ix;
  size_t backward;
  size_t idx;
  size_t j;
  size_t best_len;
  float base_cost;
  float start_costdiff;
  uint16_t inscode;
  size_t start;
  PosData *posdata_1;
  float min_cost;
  PosData *posdata;
  size_t gap;
  CompoundDictionary *addon;
  size_t k;
  size_t result;
  size_t min_len;
  size_t max_iters;
  size_t max_zopfli_len;
  size_t max_len;
  size_t dictionary_start;
  size_t max_distance;
  size_t cur_ix_masked;
  size_t cur_ix;
  size_t stream_offset;
  size_t nbits_2;
  size_t offset_2;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist_1;
  uint32_t nbits;
  uint32_t nbits_3;
  uint32_t nbits_1;
  uint32_t offset_3;
  uint16_t bits64_1;
  uint32_t offset_1;
  uint16_t bits64;
  size_t matching_bits_1;
  uint64_t x_1;
  uint8_t *s1_orig_1;
  size_t matching_bits;
  uint64_t x;
  uint8_t *s1_orig;
  uint64_t t_1;
  uint64_t t;
  uint64_t t_3;
  uint64_t t_2;
  ZopfliNode *next_1;
  ZopfliNode *next;
  size_t code;
  char *local_530;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  int *in_stack_fffffffffffffae0;
  size_t in_stack_fffffffffffffae8;
  size_t in_stack_fffffffffffffaf0;
  size_t in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  float fVar10;
  char *local_4f0;
  ulong local_4d0;
  ulong local_4c8;
  undefined4 in_stack_fffffffffffffb40;
  undefined2 in_stack_fffffffffffffb44;
  undefined2 in_stack_fffffffffffffb46;
  ZopfliNode *in_stack_fffffffffffffb48;
  undefined4 local_4a0;
  ushort local_49a;
  ulong local_498;
  uint local_48c;
  ulong local_488;
  undefined8 local_480;
  char *local_478;
  float local_470;
  ushort local_46c;
  ushort local_46a;
  char *local_468;
  float local_45c;
  long local_458;
  char *local_450;
  long local_448;
  long local_440;
  char local_431;
  char *local_430;
  ulong local_428;
  ulong local_420;
  ulong local_418;
  ulong local_410;
  char *local_408;
  float local_3fc;
  float local_3f8;
  ushort local_3f2;
  size_t local_3f0;
  PosData *local_3e8;
  float local_3dc;
  PosData *local_3d8;
  long local_3d0;
  long local_3c8;
  ulong local_3c0;
  char *local_3b8;
  char *local_3b0;
  ulong local_3a8;
  char *local_3a0;
  char *local_398;
  ulong local_390;
  ulong local_388;
  ulong local_380;
  ulong local_378;
  long local_370;
  long local_368;
  char *local_360;
  long local_358;
  size_t local_350;
  size_t local_340;
  ulong local_330;
  ulong local_320;
  undefined8 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  long local_2e8;
  long local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  undefined4 *local_2b0;
  ushort *local_2a8;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  int local_27c;
  ulong local_278;
  ushort local_26a;
  long local_268;
  long local_260;
  int local_254;
  char *local_250;
  ushort local_242;
  char *local_240;
  char *local_238;
  int local_22c;
  char *local_228;
  ushort local_21a;
  char *local_218;
  char *local_210;
  int local_208;
  ushort local_202;
  undefined4 local_200;
  ushort local_1fa;
  ushort local_1f8;
  ushort local_1f6;
  int local_1f4;
  ushort local_1ee;
  uint local_1ec;
  ushort local_1e6;
  ushort local_1e4;
  ushort local_1e2;
  ulong local_1e0;
  ulong local_1d8;
  ulong *local_1d0;
  char *local_1c8;
  ulong *local_1c0;
  ulong *local_1b8;
  char *local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong *local_198;
  char *local_190;
  ulong *local_188;
  ulong *local_180;
  char *local_178;
  ulong local_170;
  ulong *local_168;
  ulong local_160;
  ulong *local_158;
  ulong local_150;
  ulong *local_148;
  ulong local_140;
  ulong *local_138;
  size_t local_120;
  undefined8 local_118;
  size_t local_108;
  size_t local_100;
  ushort local_ea;
  long local_e8;
  ulong local_d8;
  ushort local_c6;
  ushort local_c4;
  ushort local_c2;
  ushort local_b2;
  ZopfliNode *local_a8;
  float local_9c;
  undefined8 local_98;
  ulong local_90;
  char *local_88;
  char *local_80;
  size_t local_78;
  size_t local_70;
  ZopfliNode *local_68;
  ZopfliNode *local_60;
  float local_54;
  long local_50;
  ulong local_48;
  char *local_40;
  char *local_38;
  size_t local_30;
  size_t local_28;
  ZopfliNode *local_20;
  char *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_370 = *(long *)(in_R9 + 0x10);
  local_378 = in_RSI + in_RDX;
  local_380 = local_378 & (ulong)in_R8;
  local_4c8 = local_378;
  if (in_stack_00000008 <= local_378) {
    local_4c8 = in_stack_00000008;
  }
  local_388 = local_4c8;
  local_330 = local_378 + local_370;
  local_4d0 = local_330;
  if (in_stack_00000008 <= local_330) {
    local_4d0 = in_stack_00000008;
  }
  local_390 = local_4d0;
  local_398 = (char *)(in_RDI - in_RDX);
  iVar3 = 0x145;
  if (*(int *)(in_R9 + 4) < 0xb) {
    iVar3 = 0x96;
  }
  local_3a0 = (char *)(long)iVar3;
  iVar3 = 5;
  if (*(int *)(in_R9 + 4) < 0xb) {
    iVar3 = 1;
  }
  local_3a8 = (ulong)iVar3;
  local_3b8 = (char *)0x0;
  local_3c8 = in_R9 + 0x58;
  local_3d0 = *(long *)(in_R9 + 0x60);
  local_368 = in_R9;
  local_360 = in_R8;
  local_358 = in_RCX;
  local_350 = in_RDX;
  local_340 = in_RDI;
  local_320 = local_378;
  EvaluateNode(CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               in_stack_fffffffffffffae0,
               (ZopfliCostModel *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (StartPosQueue *)
               CONCAT26(in_stack_fffffffffffffb46,
                        CONCAT24(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)),
               in_stack_fffffffffffffb48);
  local_3d8 = StartPosQueueAt(in_stack_00000030,0);
  local_100 = local_3d8->pos;
  local_108 = local_350;
  local_3dc = local_3d8->cost + *(float *)(in_stack_00000028 + 0xb18) +
              (*(float *)(*(long *)(in_stack_00000028 + 0xb10) + local_350 * 4) -
              *(float *)(*(long *)(in_stack_00000028 + 0xb10) + local_100 * 4));
  local_3b0 = (char *)ComputeMinimumCopyLength(local_3dc,in_stack_00000038,local_340,local_350);
  local_3c0 = 0;
  do {
    uVar5 = local_3c0;
    bVar8 = false;
    if (local_3c0 < local_3a8) {
      sVar4 = StartPosQueueSize(in_stack_00000030);
      bVar8 = uVar5 < sVar4;
    }
    if (!bVar8) {
      return (size_t)local_3b8;
    }
    local_3e8 = StartPosQueueAt(in_stack_00000030,local_3c0);
    local_3f0 = local_3e8->pos;
    local_278 = local_350 - local_3f0;
    if (local_278 < 6) {
      local_26a = (ushort)local_278;
    }
    else if (local_278 < 0x82) {
      local_260 = local_278 - 2;
      local_27c = 0x1f;
      if ((uint)local_260 != 0) {
        for (; (uint)local_260 >> local_27c == 0; local_27c = local_27c + -1) {
        }
      }
      local_27c = local_27c + -1;
      local_26a = (short)local_27c * 2 + (short)(local_278 - 2 >> ((byte)local_27c & 0x3f)) + 2;
    }
    else if (local_278 < 0x842) {
      local_268 = local_278 - 0x42;
      iVar3 = 0x1f;
      if ((uint)local_268 != 0) {
        for (; (uint)local_268 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      local_26a = (short)iVar3 + 10;
    }
    else if (local_278 < 0x1842) {
      local_26a = 0x15;
    }
    else if (local_278 < 0x5842) {
      local_26a = 0x16;
    }
    else {
      local_26a = 0x17;
    }
    local_3f2 = local_26a;
    local_3f8 = local_3e8->costdiff;
    local_ea = local_26a;
    local_118 = 0;
    local_120 = local_350;
    local_3fc = local_3f8 + (float)*(uint *)(duckdb_brotli::kBrotliInsExtra + (ulong)local_26a * 4)
                + (*(float *)(*(long *)(in_stack_00000028 + 0xb10) + local_350 * 4) -
                  **(float **)(in_stack_00000028 + 0xb10));
    local_408 = local_3b0 + -1;
    local_410 = 0;
    while( true ) {
      if (0xf < local_410 || local_398 <= local_408) break;
      local_418 = (ulong)kDistanceCacheIndex[local_410];
      uVar2 = local_3e8->distance_cache[local_418] + kDistanceCacheOffset[local_410];
      local_420 = (ulong)(int)uVar2;
      local_428 = local_378 - local_420;
      local_430 = (char *)0x0;
      local_431 = local_408[local_358 + local_380];
      if (local_360 < local_408 + local_380) break;
      if (local_420 <= local_390 + local_3d0) {
        if (local_388 < local_420) {
          if (local_390 < local_420) {
            local_440 = 0;
            uVar5 = local_390 + *(long *)(local_3c8 + 8);
            while (local_420 + *(long *)(local_3c8 + 0x118 + local_440 * 8) <= uVar5) {
              local_440 = local_440 + 1;
            }
            local_458 = *(long *)(local_3c8 + 0x90 + local_440 * 8);
            local_448 = (uVar5 - *(long *)(local_3c8 + 0x110 + local_440 * 8)) - local_420;
            local_4f0 = (char *)((*(long *)(local_3c8 + 0x118 + local_440 * 8) -
                                 *(long *)(local_3c8 + 0x110 + local_440 * 8)) - local_448);
            if (local_398 < local_4f0) {
              local_4f0 = local_398;
            }
            local_450 = local_4f0;
            if ((local_408 < local_4f0) && (local_431 == local_408[local_458 + local_448])) {
              local_1d0 = (ulong *)(local_458 + local_448);
              local_1c0 = (ulong *)(local_358 + local_380);
              local_1c8 = local_4f0;
              local_1b8 = local_1d0;
LAB_024121b6:
              if (local_1c8 < (char *)0x8) {
                while( true ) {
                  bVar8 = false;
                  if (local_1c8 != (char *)0x0) {
                    bVar8 = (char)*local_1b8 == (char)*local_1c0;
                  }
                  if (!bVar8) break;
                  local_1c8 = local_1c8 + -1;
                  local_1c0 = (ulong *)((long)local_1c0 + 1);
                  local_1b8 = (ulong *)((long)local_1b8 + 1);
                }
                local_1b0 = (char *)((long)local_1b8 - (long)local_1d0);
              }
              else {
                local_138 = local_1c0;
                local_140 = *local_1c0;
                local_148 = local_1b8;
                local_150 = *local_1b8;
                local_1d8 = local_140 ^ local_150;
                local_1c0 = local_1c0 + 1;
                if (local_1d8 == 0) goto LAB_02412288;
                iVar3 = 0;
                for (uVar5 = local_1d8; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                  iVar3 = iVar3 + 1;
                }
                local_1e0 = (ulong)iVar3;
                local_1b0 = (char *)((long)local_1b8 + ((local_1e0 >> 3) - (long)local_1d0));
              }
              local_430 = local_1b0;
              goto LAB_02412363;
            }
          }
        }
        else if (((local_428 < local_378) &&
                 (local_428 = (ulong)local_360 & local_428, local_408 + local_428 <= local_360)) &&
                (local_431 == local_408[local_358 + local_428])) {
          local_198 = (ulong *)(local_358 + local_428);
          local_188 = (ulong *)(local_358 + local_380);
          local_190 = local_398;
          local_180 = local_198;
LAB_02411e2a:
          if (local_190 < (char *)0x8) {
            while( true ) {
              bVar8 = false;
              if (local_190 != (char *)0x0) {
                bVar8 = (char)*local_180 == (char)*local_188;
              }
              if (!bVar8) break;
              local_190 = local_190 + -1;
              local_188 = (ulong *)((long)local_188 + 1);
              local_180 = (ulong *)((long)local_180 + 1);
            }
            local_178 = (char *)((long)local_180 - (long)local_198);
          }
          else {
            local_158 = local_188;
            local_160 = *local_188;
            local_168 = local_180;
            local_170 = *local_180;
            local_1a0 = local_160 ^ local_170;
            local_188 = local_188 + 1;
            if (local_1a0 == 0) goto LAB_02411efc;
            iVar3 = 0;
            for (uVar5 = local_1a0; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
              iVar3 = iVar3 + 1;
            }
            local_1a8 = (ulong)iVar3;
            local_178 = (char *)((long)local_180 + ((local_1a8 >> 3) - (long)local_198));
          }
          local_430 = local_178;
LAB_02412363:
          local_d8 = local_410;
          local_45c = local_3fc + *(float *)(*(long *)(in_stack_00000028 + 0xb00) + local_410 * 4);
          while (local_468 = local_408 + 1, local_468 <= local_430) {
            local_228 = local_468;
            if (local_468 < (char *)0xa) {
              local_21a = (short)local_468 - 2;
            }
            else if (local_468 < (char *)0x86) {
              local_210 = local_408 + -5;
              local_22c = 0x1f;
              if ((uint)local_210 != 0) {
                for (; (uint)local_210 >> local_22c == 0; local_22c = local_22c + -1) {
                }
              }
              local_22c = local_22c + -1;
              local_21a = (short)local_22c * 2 +
                          (short)((ulong)(local_408 + -5) >> ((byte)local_22c & 0x3f)) + 4;
            }
            else if (local_468 < (char *)0x846) {
              local_218 = local_408 + -0x45;
              iVar3 = 0x1f;
              if ((uint)local_218 != 0) {
                for (; (uint)local_218 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              local_21a = (short)iVar3 + 0xc;
            }
            else {
              local_21a = 0x17;
            }
            local_46a = local_21a;
            local_1e4 = local_26a;
            local_1e6 = local_21a;
            local_1ec = (uint)(local_410 == 0);
            local_1ee = local_21a & 7 | (local_26a & 7) << 3;
            if (((local_1ec == 0) || (7 < local_26a)) || (0xf < local_21a)) {
              iVar3 = ((int)(uint)local_21a >> 3) + ((int)(uint)local_26a >> 3) * 3;
              local_1f4 = iVar3 * 0x40 + 0x40 + (0x520d40U >> ((char)iVar3 * '\x02' & 0x1fU) & 0xc0)
              ;
              local_1e2 = (ushort)local_1f4 | local_1ee;
            }
            else {
              local_1e2 = local_1ee;
              if (7 < local_21a) {
                local_1e2 = local_1ee | 0x40;
              }
            }
            local_46c = local_1e2;
            fVar10 = local_45c;
            if (local_1e2 < 0x80) {
              fVar10 = local_3fc;
            }
            local_c4 = local_21a;
            local_b2 = local_1e2;
            local_470 = fVar10 + (float)*(uint *)(duckdb_brotli::kBrotliCopyExtra +
                                                 (ulong)local_21a * 4) +
                        *(float *)(in_stack_00000028 + (ulong)local_1e2 * 4);
            pcVar6 = local_3b8;
            if (local_470 < in_stack_00000038[(long)(local_468 + local_350)].u.cost) {
              local_50 = local_410 + 1;
              local_20 = in_stack_00000038;
              local_28 = local_350;
              local_38 = local_468;
              local_40 = local_468;
              local_60 = in_stack_00000038 + (long)(local_468 + local_350);
              local_60->length = (uint)local_468 | 0x12000000;
              local_60->distance = uVar2;
              local_60->dcode_insert_length =
                   (int)local_50 * 0x8000000 | (int)local_350 - (int)local_3f0;
              (local_60->u).cost = local_470;
              local_2f0 = local_3b8;
              local_2f8 = local_468;
              pcVar6 = local_468;
              local_54 = local_470;
              local_48 = local_420;
              local_30 = local_3f0;
              if (local_468 < local_3b8) {
                pcVar6 = local_3b8;
              }
            }
            local_3b8 = pcVar6;
            local_408 = local_468;
          }
        }
      }
      local_410 = local_410 + 1;
    }
    if (local_3c0 < 2) {
      local_478 = local_3b0;
      for (local_410 = 0; local_410 < in_stack_00000018; local_410 = local_410 + 1) {
        uVar5 = *(ulong *)(in_stack_00000020 + local_410 * 8);
        local_488 = uVar5 & 0xffffffff;
        local_48c = (uint)(local_390 + local_3d0 < local_488);
        local_498 = local_488 + 0xf;
        local_298 = (ulong)*(uint *)(local_368 + 0x3c);
        local_2a0 = (ulong)*(uint *)(local_368 + 0x38);
        local_2a8 = &local_49a;
        local_2b0 = &local_4a0;
        if (local_498 < local_298 + 0x10) {
          local_49a = (ushort)local_498;
          local_4a0 = 0;
        }
        else {
          bVar1 = (byte)*(uint *)(local_368 + 0x38);
          local_2b8 = (1L << (bVar1 + 2 & 0x3f)) + ((local_488 - 1) - local_298);
          iVar3 = 0x1f;
          if ((uint)local_2b8 != 0) {
            for (; (uint)local_2b8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          local_2c0 = (ulong)(iVar3 - 1U);
          local_2c8 = (ulong)((1 << (bVar1 & 0x1f)) - 1);
          local_2d0 = local_2b8 & local_2c8;
          bVar7 = (byte)(iVar3 - 1U);
          local_2d8 = local_2b8 >> (bVar7 & 0x3f) & 1;
          local_2e0 = local_2d8 + 2 << (bVar7 & 0x3f);
          local_2e8 = local_2c0 - local_2a0;
          local_49a = (short)local_2e8 * 0x400 |
                      (short)*(uint *)(local_368 + 0x3c) + 0x10 +
                      (short)((local_2e8 + -1) * 2 + local_2d8 << (bVar1 & 0x3f)) + (short)local_2d0
          ;
          local_4a0 = (undefined4)(local_2b8 - local_2e0 >> (bVar1 & 0x3f));
          local_288 = local_2b8;
        }
        local_e8 = (long)(int)(local_49a & 0x3ff);
        fVar10 = *(float *)(*(long *)(in_stack_00000028 + 0xb00) + local_e8 * 4);
        local_310 = &local_480;
        local_480._4_4_ = (uint)(uVar5 >> 0x20);
        pcVar6 = (char *)(ulong)(local_480._4_4_ >> 5);
        if ((local_478 < pcVar6) && ((local_48c != 0 || (local_3a0 < pcVar6)))) {
          local_478 = pcVar6;
        }
        for (; local_478 <= pcVar6; local_478 = local_478 + 1) {
          local_250 = local_478;
          if (local_48c != 0) {
            local_10 = &local_480;
            local_18 = (char *)(ulong)(local_480._4_4_ & 0x1f);
            local_250 = local_18;
            if (local_18 == (char *)0x0) {
              local_250 = (char *)(ulong)(local_480._4_4_ >> 5);
              local_8 = local_10;
            }
          }
          if (local_250 < (char *)0xa) {
            local_242 = (short)local_250 - 2;
          }
          else if (local_250 < (char *)0x86) {
            local_238 = local_250 + -6;
            local_254 = 0x1f;
            if ((uint)local_238 != 0) {
              for (; (uint)local_238 >> local_254 == 0; local_254 = local_254 + -1) {
              }
            }
            local_254 = local_254 + -1;
            local_242 = (short)local_254 * 2 +
                        (short)((ulong)(local_250 + -6) >> ((byte)local_254 & 0x3f)) + 4;
          }
          else if (local_250 < (char *)0x846) {
            local_240 = local_250 + -0x46;
            iVar3 = 0x1f;
            if ((uint)local_240 != 0) {
              for (; (uint)local_240 >> iVar3 == 0; iVar3 = iVar3 + -1) {
              }
            }
            local_242 = (short)iVar3 + 0xc;
          }
          else {
            local_242 = 0x17;
          }
          local_1f8 = local_26a;
          local_1fa = local_242;
          local_200 = 0;
          local_202 = local_242 & 7 | (local_26a & 7) << 3;
          iVar3 = ((int)(uint)local_242 >> 3) + ((int)(uint)local_26a >> 3) * 3;
          local_208 = iVar3 * 0x40 + 0x40 + (0x520d40U >> ((char)iVar3 * '\x02' & 0x1fU) & 0xc0);
          local_1f6 = (ushort)local_208 | local_202;
          local_c6 = local_242;
          fVar9 = local_3fc + (float)(local_49a >> 10) + fVar10 +
                  (float)*(uint *)(duckdb_brotli::kBrotliCopyExtra + (ulong)local_242 * 4) +
                  *(float *)(in_stack_00000028 + (ulong)local_1f6 * 4);
          if (fVar9 < in_stack_00000038[(long)(local_478 + local_350)].u.cost) {
            local_68 = in_stack_00000038;
            local_70 = local_350;
            local_80 = local_478;
            local_98 = 0;
            local_a8 = in_stack_00000038 + (long)(local_478 + local_350);
            local_a8->length =
                 (uint)local_478 | (((uint)local_478 + 9) - (int)local_250) * 0x2000000;
            local_a8->distance = (uint32_t)uVar5;
            local_a8->dcode_insert_length = (int)local_350 - (int)local_3f0;
            (local_a8->u).cost = fVar9;
            local_300 = local_3b8;
            local_308 = local_478;
            if (local_478 < local_3b8) {
              local_530 = local_3b8;
            }
            else {
              local_530 = local_478;
            }
            local_3b8 = local_530;
            local_9c = fVar9;
            local_90 = local_488;
            local_88 = local_250;
            local_78 = local_3f0;
          }
          local_c2 = local_1f6;
        }
        local_480 = uVar5;
        local_290 = local_498;
      }
    }
    local_3c0 = local_3c0 + 1;
  } while( true );
LAB_02412288:
  local_1b8 = local_1b8 + 1;
  local_1c8 = local_1c8 + -8;
  goto LAB_024121b6;
LAB_02411efc:
  local_180 = local_180 + 1;
  local_190 = local_190 + -8;
  goto LAB_02411e2a;
}

Assistant:

static size_t UpdateNodes(
    const size_t num_bytes, const size_t block_start, const size_t pos,
    const uint8_t* ringbuffer, const size_t ringbuffer_mask,
    const BrotliEncoderParams* params, const size_t max_backward_limit,
    const int* starting_dist_cache, const size_t num_matches,
    const BackwardMatch* matches, const ZopfliCostModel* model,
    StartPosQueue* queue, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t cur_ix = block_start + pos;
  const size_t cur_ix_masked = cur_ix & ringbuffer_mask;
  const size_t max_distance = BROTLI_MIN(size_t, cur_ix, max_backward_limit);
  const size_t dictionary_start = BROTLI_MIN(size_t,
      cur_ix + stream_offset, max_backward_limit);
  const size_t max_len = num_bytes - pos;
  const size_t max_zopfli_len = MaxZopfliLen(params);
  const size_t max_iters = MaxZopfliCandidates(params);
  size_t min_len;
  size_t result = 0;
  size_t k;
  const CompoundDictionary* addon = &params->dictionary.compound;
  size_t gap = addon->total_size;

  EvaluateNode(block_start + stream_offset, pos, max_backward_limit, gap,
      starting_dist_cache, model, queue, nodes);

  {
    const PosData* posdata = StartPosQueueAt(queue, 0);
    float min_cost = (posdata->cost + ZopfliCostModelGetMinCostCmd(model) +
        ZopfliCostModelGetLiteralCosts(model, posdata->pos, pos));
    min_len = ComputeMinimumCopyLength(min_cost, nodes, num_bytes, pos);
  }

  /* Go over the command starting positions in order of increasing cost
     difference. */
  for (k = 0; k < max_iters && k < StartPosQueueSize(queue); ++k) {
    const PosData* posdata = StartPosQueueAt(queue, k);
    const size_t start = posdata->pos;
    const uint16_t inscode = GetInsertLengthCode(pos - start);
    const float start_costdiff = posdata->costdiff;
    const float base_cost = start_costdiff + (float)GetInsertExtra(inscode) +
        ZopfliCostModelGetLiteralCosts(model, 0, pos);

    /* Look for last distance matches using the distance cache from this
       starting position. */
    size_t best_len = min_len - 1;
    size_t j = 0;
    for (; j < BROTLI_NUM_DISTANCE_SHORT_CODES && best_len < max_len; ++j) {
      const size_t idx = kDistanceCacheIndex[j];
      const size_t backward =
          (size_t)(posdata->distance_cache[idx] + kDistanceCacheOffset[j]);
      size_t prev_ix = cur_ix - backward;
      size_t len = 0;
      uint8_t continuation = ringbuffer[cur_ix_masked + best_len];
      if (cur_ix_masked + best_len > ringbuffer_mask) {
        break;
      }
      if (BROTLI_PREDICT_FALSE(backward > dictionary_start + gap)) {
        /* Word dictionary -> ignore. */
        continue;
      }
      if (backward <= max_distance) {
        /* Regular backward reference. */
        if (prev_ix >= cur_ix) {
          continue;
        }

        prev_ix &= ringbuffer_mask;
        if (prev_ix + best_len > ringbuffer_mask ||
            continuation != ringbuffer[prev_ix + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                       &ringbuffer[cur_ix_masked],
                                       max_len);
      } else if (backward > dictionary_start) {
        size_t d = 0;
        size_t offset;
        size_t limit;
        const uint8_t* source;
        offset = dictionary_start + 1 + addon->total_size - 1;
        while (offset >= backward + addon->chunk_offsets[d + 1]) d++;
        source = addon->chunk_source[d];
        offset = offset - addon->chunk_offsets[d] - backward;
        limit = addon->chunk_offsets[d + 1] - addon->chunk_offsets[d] - offset;
        limit = limit > max_len ? max_len : limit;
        if (best_len >= limit ||
            continuation != source[offset + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&source[offset],
                                       &ringbuffer[cur_ix_masked],
                                       limit);
      } else {
        /* "Gray" area. It is addressable by decoder, but this encoder
           instance does not have that data -> should not touch it. */
        continue;
      }
      {
        const float dist_cost = base_cost +
            ZopfliCostModelGetDistanceCost(model, j);
        size_t l;
        for (l = best_len + 1; l <= len; ++l) {
          const uint16_t copycode = GetCopyLengthCode(l);
          const uint16_t cmdcode =
              CombineLengthCodes(inscode, copycode, j == 0);
          const float cost = (cmdcode < 128 ? base_cost : dist_cost) +
              (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + l].u.cost) {
            UpdateZopfliNode(nodes, pos, start, l, l, backward, j + 1, cost);
            result = BROTLI_MAX(size_t, result, l);
          }
          best_len = l;
        }
      }
    }

    /* At higher iterations look only for new last distance matches, since
       looking only for new command start positions with the same distances
       does not help much. */
    if (k >= 2) continue;

    {
      /* Loop through all possible copy lengths at this position. */
      size_t len = min_len;
      for (j = 0; j < num_matches; ++j) {
        BackwardMatch match = matches[j];
        size_t dist = match.distance;
        BROTLI_BOOL is_dictionary_match =
            TO_BROTLI_BOOL(dist > dictionary_start + gap);
        /* We already tried all possible last distance matches, so we can use
           normal distance code here. */
        size_t dist_code = dist + BROTLI_NUM_DISTANCE_SHORT_CODES - 1;
        uint16_t dist_symbol;
        uint32_t distextra;
        uint32_t distnumextra;
        float dist_cost;
        size_t max_match_len;
        PrefixEncodeCopyDistance(
            dist_code, params->dist.num_direct_distance_codes,
            params->dist.distance_postfix_bits, &dist_symbol, &distextra);
        distnumextra = dist_symbol >> 10;
        dist_cost = base_cost + (float)distnumextra +
            ZopfliCostModelGetDistanceCost(model, dist_symbol & 0x3FF);

        /* Try all copy lengths up until the maximum copy length corresponding
           to this distance. If the distance refers to the static dictionary, or
           the maximum length is long enough, try only one maximum length. */
        max_match_len = BackwardMatchLength(&match);
        if (len < max_match_len &&
            (is_dictionary_match || max_match_len > max_zopfli_len)) {
          len = max_match_len;
        }
        for (; len <= max_match_len; ++len) {
          const size_t len_code =
              is_dictionary_match ? BackwardMatchLengthCode(&match) : len;
          const uint16_t copycode = GetCopyLengthCode(len_code);
          const uint16_t cmdcode = CombineLengthCodes(inscode, copycode, 0);
          const float cost = dist_cost + (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + len].u.cost) {
            UpdateZopfliNode(nodes, pos, start, len, len_code, dist, 0, cost);
            result = BROTLI_MAX(size_t, result, len);
          }
        }
      }
    }
  }
  return result;
}